

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O1

image * __thiscall
basisu::image::fill_box_alpha(image *this,uint32_t x,uint32_t y,uint32_t w,uint32_t h,color_rgba *c)

{
  uint32_t uVar1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint uVar5;
  
  if (h != 0) {
    uVar1 = 0;
    uVar4 = y;
    do {
      if (w != 0) {
        uVar3 = w;
        uVar2 = x;
        do {
          if ((uVar2 < this->m_width) && (uVar1 + y < this->m_height)) {
            uVar5 = this->m_pitch * uVar4 + uVar2;
            if ((this->m_pixels).m_size <= uVar5) {
              __assert_fail("i < m_size",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/encoder/../transcoder/basisu_containers.h"
                            ,0x178,
                            "T &basisu::vector<basisu::color_rgba>::operator[](size_t) [T = basisu::color_rgba]"
                           );
            }
            (this->m_pixels).m_p[uVar5].field_0.m_comps[3] = (c->field_0).m_comps[3];
          }
          uVar2 = uVar2 + 1;
          uVar3 = uVar3 - 1;
        } while (uVar3 != 0);
      }
      uVar1 = uVar1 + 1;
      uVar4 = uVar4 + 1;
    } while (uVar1 != h);
  }
  return this;
}

Assistant:

image& fill_box_alpha(uint32_t x, uint32_t y, uint32_t w, uint32_t h, const color_rgba& c)
		{
			for (uint32_t iy = 0; iy < h; iy++)
				for (uint32_t ix = 0; ix < w; ix++)
					set_clipped_alpha(x + ix, y + iy, c);
			return *this;
		}